

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_std::shared_ptr<kratos::Var>_>
::load(list_caster<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_std::shared_ptr<kratos::Var>_>
       *this,handle src,bool convert)

{
  byte bVar1;
  bool bVar2;
  template_cast_op_type<typename_std::add_rvalue_reference<shared_ptr<Var>_&&>::type> __x;
  sequence_iterator sVar3;
  sequence_slow_readwrite sVar4;
  handle local_e0;
  PyObject *local_d8;
  undefined1 local_d0 [8];
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence local_48;
  sequence s;
  bool convert_local;
  list_caster<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_std::shared_ptr<kratos::Var>_>
  *this_local;
  handle src_local;
  
  bVar2 = isinstance<pybind11::sequence,_0>(src);
  if (((!bVar2) || (bVar2 = isinstance<pybind11::bytes,_0>(src), bVar2)) ||
     (s.super_object.super_handle.m_ptr = (object)(object)src.m_ptr,
     bVar2 = isinstance<pybind11::str,_0>(src), bVar2)) {
    src_local.m_ptr._7_1_ = 0;
  }
  else {
    reinterpret_borrow<pybind11::sequence>((pybind11 *)&local_48,src);
    std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::clear
              (&this->value);
    reserve_maybe<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_0>
              (this,&local_48,&this->value);
    sVar3 = sequence::begin(&local_48);
    __end3.super_sequence_slow_readwrite.index =
         (ssize_t)sVar3.super_sequence_slow_readwrite.obj.m_ptr;
    sVar4 = (sequence_slow_readwrite)sequence::end(&local_48);
    while( true ) {
      __end3.super_sequence_slow_readwrite.obj.m_ptr = (PyObject *)sVar4.index;
      it.cache.super_handle.m_ptr = sVar4.obj.m_ptr;
      bVar2 = detail::operator!=((It *)&__end3.super_sequence_slow_readwrite.index,(It *)&it.cache);
      if (!bVar2) break;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                ((reference *)
                 &conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>
                  .holder.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      type_caster<std::shared_ptr<kratos::Var>,_void>::type_caster
                ((type_caster<std::shared_ptr<kratos::Var>,_void> *)local_d0);
      accessor::operator_cast_to_object((accessor *)&local_e0);
      local_d8 = local_e0.m_ptr;
      bVar2 = copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>::load
                        ((copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void> *)
                         local_d0,local_e0,convert);
      object::~object((object *)&local_e0);
      bVar1 = (bVar2 ^ 0xffU) & 1;
      if (bVar1 == 0) {
        __x = cast_op<std::shared_ptr<kratos::Var>&&>
                        ((make_caster<std::shared_ptr<kratos::Var>_&&> *)local_d0);
        std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
        push_back(&this->value,__x);
      }
      else {
        src_local.m_ptr._7_1_ = 0;
      }
      type_caster<std::shared_ptr<kratos::Var>,_void>::~type_caster
                ((type_caster<std::shared_ptr<kratos::Var>,_void> *)local_d0);
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 &conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>
                  .holder.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (bVar1 != 0) goto LAB_0079141e;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 &__end3.super_sequence_slow_readwrite.index);
      sVar4.index = (ssize_t)__end3.super_sequence_slow_readwrite.obj.m_ptr;
      sVar4.obj = it.cache.super_handle.m_ptr;
    }
    src_local.m_ptr._7_1_ = 1;
LAB_0079141e:
    sequence::~sequence(&local_48);
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }